

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict2pid.c
# Opt level: O2

int dict2pid_add_word(dict2pid_t *d2p,int32 wid)

{
  short sVar1;
  short sVar2;
  bin_mdef_t *m;
  dict_t *pdVar3;
  xwdssid_t **ppxVar4;
  s3cipid_t *psVar5;
  int iVar6;
  dictword_t *pdVar7;
  char *pcVar8;
  s3ssid_t *uncomp_tab;
  long lVar9;
  s3ssid_t *com_tab;
  s3cipid_t *psVar10;
  int iVar11;
  short *psVar12;
  
  m = d2p->mdef;
  pdVar3 = d2p->dict;
  pdVar7 = pdVar3->word;
  iVar11 = pdVar7[wid].pronlen;
  if (iVar11 < 2) {
    pcVar8 = bin_mdef_ciphone_str(m,(int)*pdVar7[wid].ciphone);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict2pid.c"
            ,0x168,"Filling in context triphones for %s(?,?)\n",pcVar8);
    sVar1 = *pdVar3->word[wid].ciphone;
    if (**d2p->lrdiph_rc[sVar1] == 0xffff) {
      populate_lrdiph(d2p,(s3ssid_t ***)0x0,sVar1);
    }
  }
  else {
    psVar12 = pdVar7[wid].ciphone;
    if (*d2p->ldiph_lc[*psVar12][psVar12[1]] == 0xffff) {
      for (iVar11 = 0; iVar11 = (int)(short)iVar11, iVar11 < m->n_ciphone; iVar11 = iVar11 + 1) {
        iVar6 = bin_mdef_phone_id_nearest
                          (m,(int)*pdVar7[wid].ciphone,iVar11,(int)pdVar7[wid].ciphone[1],1);
        pdVar7 = pdVar3->word;
        d2p->ldiph_lc[*pdVar7[wid].ciphone][pdVar7[wid].ciphone[1]][iVar11] =
             (s3ssid_t)m->phone[iVar6].ssid;
      }
      psVar12 = pdVar7[wid].ciphone;
      iVar11 = pdVar7[wid].pronlen;
    }
    if (d2p->rssid[psVar12[(long)iVar11 + -1]][psVar12[(long)iVar11 + -2]].n_ssid == 0) {
      uncomp_tab = (s3ssid_t *)
                   __ckd_calloc__((long)m->n_ciphone,2,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict2pid.c"
                                  ,0x150);
      iVar11 = 0;
      while( true ) {
        iVar11 = (int)(short)iVar11;
        if (m->n_ciphone <= iVar11) break;
        psVar10 = pdVar3->word[wid].ciphone;
        lVar9 = (long)pdVar3->word[wid].pronlen;
        iVar6 = bin_mdef_phone_id_nearest
                          (m,(int)psVar10[lVar9 + -1],(int)psVar10[lVar9 + -2],iVar11,2);
        uncomp_tab[iVar11] = (s3ssid_t)m->phone[iVar6].ssid;
        iVar11 = iVar11 + 1;
      }
      com_tab = (s3ssid_t *)
                __ckd_calloc__((long)m->n_ciphone,2,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict2pid.c"
                               ,0x159);
      psVar10 = (s3cipid_t *)
                __ckd_calloc__((long)m->n_ciphone,2,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict2pid.c"
                               ,0x15a);
      compress_table(uncomp_tab,com_tab,psVar10,m->n_ciphone);
      iVar11 = 0;
      do {
        iVar6 = (int)(short)iVar11;
        if (m->n_ciphone <= iVar6) break;
        iVar11 = iVar6 + 1;
      } while (com_tab[iVar6] != 0xffff);
      ppxVar4 = d2p->rssid;
      psVar5 = pdVar3->word[wid].ciphone;
      lVar9 = (long)pdVar3->word[wid].pronlen;
      sVar1 = psVar5[lVar9 + -1];
      sVar2 = psVar5[lVar9 + -2];
      ppxVar4[sVar1][sVar2].ssid = com_tab;
      ppxVar4[sVar1][sVar2].cimap = psVar10;
      ppxVar4[sVar1][sVar2].n_ssid = iVar6;
      ckd_free(uncomp_tab);
    }
  }
  return 0;
}

Assistant:

int
dict2pid_add_word(dict2pid_t *d2p,
                  int32 wid)
{
    bin_mdef_t *mdef = d2p->mdef;
    dict_t *d = d2p->dict;

    if (dict_pronlen(d, wid) > 1) {
        s3cipid_t l;
        /* Make sure we have left and right context diphones for this
         * word. */
        if (d2p->ldiph_lc[dict_first_phone(d, wid)][dict_second_phone(d, wid)][0]
            == BAD_S3SSID) {
            E_DEBUG("Filling in left-context diphones for %s(?,%s)\n",
                   bin_mdef_ciphone_str(mdef, dict_first_phone(d, wid)),
                   bin_mdef_ciphone_str(mdef, dict_second_phone(d, wid)));
            for (l = 0; l < bin_mdef_n_ciphone(mdef); l++) {
                int p
                    = bin_mdef_phone_id_nearest(mdef,
                                                dict_first_phone(d, wid), l,
                                                dict_second_phone(d, wid),
                                                WORD_POSN_BEGIN);
                d2p->ldiph_lc[dict_first_phone(d, wid)][dict_second_phone(d, wid)][l]
                    = bin_mdef_pid2ssid(mdef, p);
            }
        }
        if (d2p->rssid[dict_last_phone(d, wid)][dict_second_last_phone(d, wid)].n_ssid
            == 0) {
            s3ssid_t *rmap;
            s3ssid_t *tmpssid;
            s3cipid_t *tmpcimap;
            s3cipid_t r;

            E_DEBUG("Filling in right-context diphones for %s(%s,?)\n",
                   bin_mdef_ciphone_str(mdef, dict_last_phone(d, wid)),
                   bin_mdef_ciphone_str(mdef, dict_second_last_phone(d, wid)));
            rmap = ckd_calloc(bin_mdef_n_ciphone(mdef), sizeof(*rmap));
            for (r = 0; r < bin_mdef_n_ciphone(mdef); r++) {
                int p
                    = bin_mdef_phone_id_nearest(mdef,
                                                dict_last_phone(d, wid),
                                                dict_second_last_phone(d, wid), r,
                                                WORD_POSN_END);
                rmap[r] = bin_mdef_pid2ssid(mdef, p);
            }
            tmpssid = ckd_calloc(bin_mdef_n_ciphone(mdef), sizeof(*tmpssid));
            tmpcimap = ckd_calloc(bin_mdef_n_ciphone(mdef), sizeof(*tmpcimap));
            compress_table(rmap, tmpssid, tmpcimap, bin_mdef_n_ciphone(mdef));
            for (r = 0; r < mdef->n_ciphone && tmpssid[r] != BAD_S3SSID; r++)
                ;
            d2p->rssid[dict_last_phone(d, wid)][dict_second_last_phone(d, wid)].ssid = tmpssid;
            d2p->rssid[dict_last_phone(d, wid)][dict_second_last_phone(d, wid)].cimap = tmpcimap;
            d2p->rssid[dict_last_phone(d, wid)][dict_second_last_phone(d, wid)].n_ssid = r;
            ckd_free(rmap);
        }
    }
    else {
        /* Make sure we have a left-right context triphone entry for
         * this word. */
        E_INFO("Filling in context triphones for %s(?,?)\n",
               bin_mdef_ciphone_str(mdef, dict_first_phone(d, wid)));
        if (d2p->lrdiph_rc[dict_first_phone(d, wid)][0][0] == BAD_S3SSID) {
            populate_lrdiph(d2p, NULL, dict_first_phone(d, wid));
        }
    }

    return 0;
}